

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::add_rule
          (filter_impl<std::array<unsigned_char,_4UL>_> *this,array<unsigned_char,_4UL> first,
          array<unsigned_char,_4UL> last,uint32_t flags)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  pointer prVar4;
  bool local_152;
  bool local_151;
  _Self local_130;
  _Type local_124;
  range local_120;
  const_iterator local_118;
  _Base_ptr local_110;
  array<unsigned_char,_4UL> local_104;
  _Self local_100;
  array<unsigned_char,_4UL> local_f4;
  _Self local_f0;
  _Base_ptr local_e8;
  _Type local_dc;
  range local_d8;
  const_iterator local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
  local_a0;
  _Self local_98;
  _Type local_8c;
  range local_88;
  const_iterator local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
  local_68;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t last_access;
  uint32_t first_access;
  _Type local_4c;
  range local_48;
  _Self local_40;
  iterator j;
  range local_30;
  _Self local_28;
  iterator i;
  uint32_t flags_local;
  filter_impl<std::array<unsigned_char,_4UL>_> *this_local;
  array<unsigned_char,_4UL> last_local;
  array<unsigned_char,_4UL> first_local;
  
  j._M_node._4_4_ = first._M_elems;
  i._M_node._4_4_ = flags;
  this_local._0_4_ = last._M_elems;
  this_local._4_4_ = first._M_elems;
  range::range(&local_30,first,0);
  local_28._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
       ::upper_bound(&this->m_access_list,&local_30);
  local_4c[0] = (uchar)this_local;
  local_4c[1] = this_local._1_1_;
  local_4c[2] = this_local._2_1_;
  local_4c[3] = this_local._3_1_;
  range::range(&local_48,this_local._0_4_,0);
  local_40._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
       ::upper_bound(&this->m_access_list,&local_48);
  _last_access = ::std::
                 set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                 ::begin(&this->m_access_list);
  bVar2 = ::std::operator!=(&local_28,(_Self *)&last_access);
  if (bVar2) {
    ::std::
    _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>::
    operator--(&local_28);
  }
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
           ::operator->(&local_28);
  local_5c = prVar4->access;
  local_70 = local_40._M_node;
  local_68 = ::std::
             prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                       (local_40._M_node,1);
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
           ::operator->(&local_68);
  local_60 = prVar4->access;
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
           ::operator->(&local_28);
  bVar2 = ::std::operator!=(&prVar4->start,(array<unsigned_char,_4UL> *)((long)&this_local + 4));
  if ((bVar2) && (local_5c != i._M_node._4_4_)) {
    local_80._M_node = local_28._M_node;
    local_8c[0] = this_local._4_1_;
    local_8c[1] = this_local._5_1_;
    local_8c[2] = this_local._6_1_;
    local_8c[3] = this_local._7_1_;
    range::range(&local_88,this_local._4_4_,i._M_node._4_4_);
    local_78 = (_Base_ptr)
               ::std::
               set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
               ::insert(&this->m_access_list,local_80,&local_88);
    local_28._M_node = local_78;
  }
  else {
    local_98._M_node =
         (_Base_ptr)
         ::std::
         set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
         ::begin(&this->m_access_list);
    bVar3 = ::std::operator!=(&local_28,&local_98);
    bVar2 = false;
    if (bVar3) {
      local_a8 = local_28._M_node;
      local_a0 = ::std::
                 prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                           (local_28._M_node,1);
      prVar4 = ::std::
               _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
               ::operator->(&local_a0);
      bVar2 = prVar4->access == i._M_node._4_4_;
    }
    if (bVar2) {
      ::std::
      _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
      ::operator--(&local_28);
      prVar4 = ::std::
               _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
               ::operator->(&local_28);
      local_5c = prVar4->access;
    }
  }
  bVar2 = ::std::operator!=(&local_28,&local_40);
  if (bVar2) {
    local_b8 = local_28._M_node;
    local_b0 = (_Base_ptr)
               ::std::
               next<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                         (local_28._M_node,1);
    local_c0 = local_40._M_node;
    local_c8 = (_Base_ptr)
               ::std::
               set<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
               ::erase_abi_cxx11_((set<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                                   *)this,(const_iterator)local_b0,local_40._M_node);
  }
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
           ::operator->(&local_28);
  bVar2 = ::std::operator==(&prVar4->start,(array<unsigned_char,_4UL> *)((long)&this_local + 4));
  if (bVar2) {
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
             ::operator->(&local_28);
    uVar1 = i._M_node._4_4_;
    *&(prVar4->start)._M_elems = this_local._4_4_;
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
             ::operator->(&local_28);
    prVar4->access = uVar1;
  }
  else if (local_5c != i._M_node._4_4_) {
    local_d0._M_node = local_28._M_node;
    local_dc[0] = this_local._4_1_;
    local_dc[1] = this_local._5_1_;
    local_dc[2] = this_local._6_1_;
    local_dc[3] = this_local._7_1_;
    range::range(&local_d8,this_local._4_4_,i._M_node._4_4_);
    local_e8 = (_Base_ptr)
               ::std::
               set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
               ::insert(&this->m_access_list,local_d0,&local_d8);
  }
  local_f0._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
       ::end(&this->m_access_list);
  bVar2 = ::std::operator!=(&local_40,&local_f0);
  if (bVar2) {
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
             ::operator->(&local_40);
    local_f4 = minus_one<std::array<unsigned_char,4ul>>(&prVar4->start);
    bVar2 = ::std::operator!=(&local_f4,(array<unsigned_char,_4UL> *)&this_local);
    local_151 = true;
    if (bVar2) goto LAB_003cd29c;
  }
  local_100._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
       ::end(&this->m_access_list);
  bVar2 = ::std::operator==(&local_40,&local_100);
  local_152 = false;
  if (bVar2) {
    local_104 = max_addr<std::array<unsigned_char,4ul>>();
    local_152 = ::std::operator!=((array<unsigned_char,_4UL> *)&this_local,&local_104);
  }
  local_151 = local_152;
LAB_003cd29c:
  if ((local_151 != false) && (local_60 != i._M_node._4_4_)) {
    local_118._M_node = local_40._M_node;
    local_124 = (_Type)plus_one<std::array<unsigned_char,4ul>>
                                 ((array<unsigned_char,_4UL> *)&this_local);
    range::range(&local_120,(array<unsigned_char,_4UL>)local_124,local_60);
    local_110 = (_Base_ptr)
                ::std::
                set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                ::insert(&this->m_access_list,local_118,&local_120);
    local_40._M_node = local_110;
  }
  local_130._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
       ::end(&this->m_access_list);
  bVar3 = ::std::operator!=(&local_40,&local_130);
  bVar2 = false;
  if (bVar3) {
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
             ::operator->(&local_40);
    bVar2 = prVar4->access == i._M_node._4_4_;
  }
  if (bVar2) {
    ::std::
    set<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
    ::erase_abi_cxx11_((set<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                        *)this,(const_iterator)local_40._M_node);
  }
  return;
}

Assistant:

void filter_impl<Addr>::add_rule(Addr first, Addr last, std::uint32_t const flags)
	{
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(first < last || first == last);

		auto i = m_access_list.upper_bound(first);
		auto j = m_access_list.upper_bound(last);

		if (i != m_access_list.begin()) --i;

		TORRENT_ASSERT(j != m_access_list.begin());
		TORRENT_ASSERT(j != i);

		std::uint32_t first_access = i->access;
		std::uint32_t last_access = std::prev(j)->access;

		if (i->start != first && first_access != flags)
		{
			i = m_access_list.insert(i, range(first, flags));
		}
		else if (i != m_access_list.begin() && std::prev(i)->access == flags)
		{
			--i;
			first_access = i->access;
		}
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(i != m_access_list.end());

		if (i != j) m_access_list.erase(std::next(i), j);
		if (i->start == first)
		{
			// This is an optimization over erasing and inserting a new element
			// here.
			// this const-cast is OK because we know that the new
			// start address will keep the set correctly ordered
			const_cast<Addr&>(i->start) = first;
			const_cast<std::uint32_t&>(i->access) = flags;
		}
		else if (first_access != flags)
		{
			m_access_list.insert(i, range(first, flags));
		}

		if ((j != m_access_list.end()
				&& minus_one(j->start) != last)
			|| (j == m_access_list.end()
				&& last != max_addr<Addr>()))
		{
			TORRENT_ASSERT(j == m_access_list.end() || last < minus_one(j->start));
			if (last_access != flags)
				j = m_access_list.insert(j, range(plus_one(last), last_access));
		}

		if (j != m_access_list.end() && j->access == flags) m_access_list.erase(j);
		TORRENT_ASSERT(!m_access_list.empty());
	}